

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O1

bool Assimp::Blender::read<Assimp::Blender::MLoop>
               (Structure *s,MLoop *p,size_t cnt,FileDatabase *db)

{
  int *piVar1;
  MLoop read;
  MLoop local_48;
  
  if (cnt != 0) {
    piVar1 = &p->v;
    do {
      local_48.super_ElemBase.dna_type = (char *)0x0;
      local_48.super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_008ef3f0;
      Structure::Convert<Assimp::Blender::MLoop>(s,&local_48,db);
      *(char **)(piVar1 + -2) = local_48.super_ElemBase.dna_type;
      *(undefined8 *)piVar1 = local_48._16_8_;
      piVar1 = piVar1 + 6;
      cnt = cnt - 1;
    } while (cnt != 0);
  }
  return true;
}

Assistant:

bool read(const Structure &s, T *p, const size_t cnt, const FileDatabase &db) {
            for (size_t i = 0; i < cnt; ++i) {
                T read;
                s.Convert(read, db);
                *p = read;
                p++;
            }
            return true;
        }